

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O0

void __thiscall anon_unknown.dwarf_153ab3::IntegerExpr::printLeft(IntegerExpr *this,OutputStream *S)

{
  size_t sVar1;
  char *pcVar2;
  StringView R;
  StringView local_58;
  StringView local_48;
  char *local_38;
  char *local_30;
  StringView local_28;
  OutputStream *local_18;
  OutputStream *S_local;
  IntegerExpr *this_local;
  
  local_18 = S;
  S_local = (OutputStream *)this;
  sVar1 = StringView::size(&this->Type);
  if (3 < sVar1) {
    StringView::StringView(&local_28,"(");
    OutputStream::operator+=(local_18,local_28);
    local_38 = (this->Type).First;
    local_30 = (this->Type).Last;
    OutputStream::operator+=(local_18,this->Type);
    StringView::StringView(&local_48,")");
    OutputStream::operator+=(local_18,local_48);
  }
  pcVar2 = StringView::operator[](&this->Value,0);
  if (*pcVar2 == 'n') {
    StringView::StringView(&local_58,"-");
    OutputStream::operator+=(local_18,local_58);
    R = StringView::dropFront(&this->Value,1);
    OutputStream::operator+=(local_18,R);
  }
  else {
    OutputStream::operator+=(local_18,this->Value);
  }
  sVar1 = StringView::size(&this->Type);
  if (sVar1 < 4) {
    OutputStream::operator+=(local_18,this->Type);
  }
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    if (Type.size() > 3) {
      S += "(";
      S += Type;
      S += ")";
    }

    if (Value[0] == 'n') {
      S += "-";
      S += Value.dropFront(1);
    } else
      S += Value;

    if (Type.size() <= 3)
      S += Type;
  }